

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::insertAfterNode
          (LinkedList<char> *this,ListNode<char> *_current,char *new_element)

{
  ListNode<char> *pLVar1;
  
  pLVar1 = (ListNode<char> *)operator_new(0x18);
  pLVar1->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010bd88;
  pLVar1->element = *new_element;
  pLVar1->_next = _current->_next;
  _current->_next = pLVar1;
  this->_size = this->_size + 1;
  if (this->_tail == _current) {
    this->_tail = pLVar1;
  }
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::insertAfterNode(ListNode<T>* _current, const T &new_element){
        _current->insertAfter(new ListNode<T>(new_element));
        _size++;
        if (_current == _tail) {
            _tail = _current->next();
        }
        return this;
    }